

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

char32_t __thiscall pegmatite::Context::symbol(Context *this)

{
  bool bVar1;
  char32_t cVar2;
  Context *this_local;
  
  bVar1 = end(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/parser.cc"
                  ,0xf0,"char32_t pegmatite::Context::symbol() const");
  }
  cVar2 = Input::iterator::operator*(&(this->position).it);
  return cVar2;
}

Assistant:

char32_t symbol() const
	{
		assert(!end());
		return *position.it;
	}